

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

size_t http_date2rfc7231(char *target,tm_conflict *tmbuf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  
  *target = *DAY_NAMES[tmbuf->tm_wday];
  target[1] = DAY_NAMES[tmbuf->tm_wday][1];
  target[2] = DAY_NAMES[tmbuf->tm_wday][2];
  target[3] = ',';
  target[4] = ' ';
  cVar2 = (char)(tmbuf->tm_mday / 10);
  target[5] = cVar2 + '0';
  target[6] = cVar2 * -10 + (char)tmbuf->tm_mday + '0';
  target[7] = ' ';
  target[8] = *MONTH_NAMES[tmbuf->tm_mon];
  target[9] = MONTH_NAMES[tmbuf->tm_mon][1];
  target[10] = MONTH_NAMES[tmbuf->tm_mon][2];
  target[0xb] = ' ';
  sVar3 = fio_ltoa(target + 0xc,(long)tmbuf->tm_year + 0x76c,'\n');
  target[sVar3 + 0xc] = ' ';
  cVar2 = (char)(tmbuf->tm_hour / 10);
  target[sVar3 + 0xd] = cVar2 + '0';
  target[sVar3 + 0xe] = cVar2 * -10 + (char)tmbuf->tm_hour + '0';
  target[sVar3 + 0xf] = ':';
  cVar2 = (char)(tmbuf->tm_min / 10);
  target[sVar3 + 0x10] = cVar2 + '0';
  target[sVar3 + 0x11] = cVar2 * -10 + (char)tmbuf->tm_min + '0';
  target[sVar3 + 0x12] = ':';
  cVar2 = (char)(tmbuf->tm_sec / 10);
  target[sVar3 + 0x13] = cVar2 + '0';
  target[sVar3 + 0x14] = cVar2 * -10 + (char)tmbuf->tm_sec + '0';
  pcVar1 = target + sVar3 + 0x15;
  pcVar1[0] = ' ';
  pcVar1[1] = 'G';
  pcVar1[2] = 'M';
  pcVar1[3] = 'T';
  target[sVar3 + 0x19] = '\0';
  return (long)(target + sVar3 + 0x19) - (long)target;
}

Assistant:

size_t http_date2rfc7231(char *target, struct tm *tmbuf) {
  /* note: day of month is always 2 digits */
  char *pos = target;
  uint16_t tmp;
  pos[0] = DAY_NAMES[tmbuf->tm_wday][0];
  pos[1] = DAY_NAMES[tmbuf->tm_wday][1];
  pos[2] = DAY_NAMES[tmbuf->tm_wday][2];
  pos[3] = ',';
  pos[4] = ' ';
  pos += 5;
  tmp = tmbuf->tm_mday / 10;
  pos[0] = '0' + tmp;
  pos[1] = '0' + (tmbuf->tm_mday - (tmp * 10));
  pos += 2;
  *(pos++) = ' ';
  pos[0] = MONTH_NAMES[tmbuf->tm_mon][0];
  pos[1] = MONTH_NAMES[tmbuf->tm_mon][1];
  pos[2] = MONTH_NAMES[tmbuf->tm_mon][2];
  pos[3] = ' ';
  pos += 4;
  // write year.
  pos += fio_ltoa(pos, tmbuf->tm_year + 1900, 10);
  *(pos++) = ' ';
  tmp = tmbuf->tm_hour / 10;
  pos[0] = '0' + tmp;
  pos[1] = '0' + (tmbuf->tm_hour - (tmp * 10));
  pos[2] = ':';
  tmp = tmbuf->tm_min / 10;
  pos[3] = '0' + tmp;
  pos[4] = '0' + (tmbuf->tm_min - (tmp * 10));
  pos[5] = ':';
  tmp = tmbuf->tm_sec / 10;
  pos[6] = '0' + tmp;
  pos[7] = '0' + (tmbuf->tm_sec - (tmp * 10));
  pos += 8;
  pos[0] = ' ';
  pos[1] = GMT_STR[0];
  pos[2] = GMT_STR[1];
  pos[3] = GMT_STR[2];
  pos[4] = 0;
  pos += 4;
  return pos - target;
}